

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult access_tda(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  bool bVar3;
  
  iVar1 = arm_current_el(env);
  if (((env->cp15).mdcr_el2 & 0x300) == 0) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    bVar3 = ((uint)uVar2 >> 0x1b & 1) == 0;
  }
  else {
    bVar3 = false;
  }
  if ((1 < iVar1) || (bVar3)) {
    if (2 < iVar1) {
      return CP_ACCESS_OK;
    }
  }
  else {
    if ((env->features & 0x200000000) == 0) {
      return CP_ACCESS_TRAP_EL2;
    }
    if (((env->cp15).scr_el3 & 1) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  if (((env->cp15).mdcr_el3 & 0x200) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL3;
}

Assistant:

static CPAccessResult access_tda(CPUARMState *env, const ARMCPRegInfo *ri,
                                  bool isread)
{
    int el = arm_current_el(env);
    bool mdcr_el2_tda = (env->cp15.mdcr_el2 & MDCR_TDA) ||
        (env->cp15.mdcr_el2 & MDCR_TDE) ||
        (arm_hcr_el2_eff(env) & HCR_TGE);

    if (el < 2 && mdcr_el2_tda && !arm_is_secure_below_el3(env)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 && (env->cp15.mdcr_el3 & MDCR_TDA)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}